

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnViewPrivate::initialize(QColumnViewPrivate *this)

{
  QPropertyAnimation *pQVar1;
  QAbstractItemView *this_00;
  void **ppvVar2;
  void *pvVar3;
  Data *pDVar4;
  QObject *pQVar5;
  undefined4 *puVar6;
  QStyledItemDelegate *this_01;
  long in_FS_OFFSET;
  QByteArray local_68;
  void *local_50;
  code *local_48;
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QAbstractItemView::setTextElideMode(this_00,ElideMiddle);
  pQVar1 = &this->currentAnimation;
  local_68.d.d = (Data *)QAbstractAnimation::finished;
  local_68.d.ptr = (char *)0x0;
  local_48 = changeCurrentColumn;
  local_40 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QColumnViewPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar6 + 4) = changeCurrentColumn;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_50,(void **)pQVar1,(QObject *)&local_68,ppvVar2,
             (QSlotObjectBase *)&local_48,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  pvVar3 = (this->animationConnection).d_ptr;
  (this->animationConnection).d_ptr = local_50;
  local_50 = pvVar3;
  QMetaObject::Connection::~Connection((Connection *)&local_50);
  QPropertyAnimation::setTargetObject((QObject *)pQVar1);
  QByteArray::QByteArray(&local_68,"value",-1);
  QPropertyAnimation::setPropertyName((QByteArray *)pQVar1);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  QEasingCurve::QEasingCurve((QEasingCurve *)&local_68,InOutQuad);
  QVariantAnimation::setEasingCurve((QEasingCurve *)pQVar1);
  QEasingCurve::~QEasingCurve((QEasingCurve *)&local_68);
  pDVar4 = (this->super_QAbstractItemViewPrivate).itemDelegate.wp.d;
  if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
     (pQVar5 = (this->super_QAbstractItemViewPrivate).itemDelegate.wp.value,
     pQVar5 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar5 + 0x20))();
  }
  this_01 = (QStyledItemDelegate *)operator_new(0x10);
  QStyledItemDelegate::QStyledItemDelegate(this_01,(QObject *)this_00);
  *(undefined ***)this_01 = &PTR_metaObject_0080d070;
  QAbstractItemView::setItemDelegate(this_00,(QAbstractItemDelegate *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::initialize()
{
    Q_Q(QColumnView);
    q->setTextElideMode(Qt::ElideMiddle);
#if QT_CONFIG(animation)
    animationConnection =
        QObjectPrivate::connect(&currentAnimation, &QPropertyAnimation::finished,
                                this, &QColumnViewPrivate::changeCurrentColumn);
    currentAnimation.setTargetObject(hbar);
    currentAnimation.setPropertyName("value");
    currentAnimation.setEasingCurve(QEasingCurve::InOutQuad);
#endif // animation
    delete itemDelegate;
    q->setItemDelegate(new QColumnViewDelegate(q));
}